

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall
llm_tokenizer_ugm_session::normalize
          (llm_tokenizer_ugm_session *this,string *input,string *normalized)

{
  bool bVar1;
  string *psVar2;
  bool bVar3;
  bool bVar4;
  undefined1 *puVar5;
  string *in_RDX;
  size_t in_RSI;
  string *in_RDI;
  llm_tokenizer_ugm_session *unaff_retaddr;
  char c;
  size_t i;
  normalization_result norm_res;
  size_t input_offset;
  size_t input_len;
  bool processing_non_ws;
  bool is_space_prepended;
  bool shall_merge_spaces;
  bool shall_append_space;
  bool shall_prepend_space;
  string space;
  bool local_aa;
  bool local_a9;
  char *local_88;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  _Alloc_hider *local_68;
  allocator<char> local_39;
  string local_38 [32];
  string *local_18;
  string *input_00;
  
  local_18 = in_RDX;
  input_00 = in_RDI;
  std::__cxx11::string::clear();
  psVar2 = local_18;
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)psVar2);
  bVar3 = llama_vocab::get_escape_whitespaces((llama_vocab *)0x549dfe);
  if (bVar3) {
    std::__cxx11::string::string(local_38,(string *)(in_RDI->_M_string_length + 8));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_39);
  }
  bVar3 = llama_vocab::get_treat_whitespace_as_suffix((llama_vocab *)0x549e76);
  local_a9 = false;
  if (!bVar3) {
    local_a9 = llama_vocab::get_add_space_prefix((llama_vocab *)0x549e90);
  }
  bVar3 = llama_vocab::get_treat_whitespace_as_suffix((llama_vocab *)0x549eac);
  local_aa = false;
  if (bVar3) {
    local_aa = llama_vocab::get_add_space_prefix((llama_vocab *)0x549ec8);
  }
  bVar4 = llama_vocab::get_remove_extra_whitespaces((llama_vocab *)0x549ee4);
  bVar1 = false;
  bVar3 = false;
  puVar5 = (undefined1 *)std::__cxx11::string::size();
  for (local_68 = (_Alloc_hider *)0x0; local_68 < puVar5;
      local_68 = &in_stack_ffffffffffffff90->_M_dataplus + (long)local_68) {
    normalize_prefix(unaff_retaddr,input_00,in_RSI);
    for (local_88 = (char *)0x0; local_88 < in_stack_ffffffffffffff88; local_88 = local_88 + 1) {
      if (in_stack_ffffffffffffff80[(long)local_88] == (allocator<char>)0x20) {
        if (bVar3) {
          bVar3 = false;
        }
        if (!bVar4) {
          std::__cxx11::string::append(local_18);
        }
      }
      else {
        if ((!bVar3) && (((bVar3 = true, local_a9 != false && (!bVar1)) || (bVar4)))) {
          std::__cxx11::string::append(local_18);
          bVar1 = true;
        }
        std::__cxx11::string::push_back((char)local_18);
      }
    }
  }
  if (local_aa != false) {
    std::__cxx11::string::append(local_18);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void normalize(const std::string& input, std::string * normalized) {
        normalized->clear();
        normalized->reserve(input.size() * 3);

        const std::string space = vocab.get_escape_whitespaces() ? tokenizer.escaped_space : " ";

        const bool shall_prepend_space = !vocab.get_treat_whitespace_as_suffix() && vocab.get_add_space_prefix();
        const bool shall_append_space  =  vocab.get_treat_whitespace_as_suffix() && vocab.get_add_space_prefix();
        const bool shall_merge_spaces  =  vocab.get_remove_extra_whitespaces();

        bool is_space_prepended = false;
        bool processing_non_ws = false;

        size_t input_len = input.size();

        for (size_t input_offset = 0; input_offset < input_len; ) {
            auto norm_res = normalize_prefix(input, input_offset);
            for (size_t i = 0; i < norm_res.normalized_len; i++) {
                char c = norm_res.normalized[i];
                if (c != ' ') {
                    if (!processing_non_ws) {
                        processing_non_ws = true;
                        if ((shall_prepend_space && !is_space_prepended) || shall_merge_spaces) {
                            normalized->append(space);
                            is_space_prepended = true;
                        }
                    }
                    normalized->push_back(c);
                } else {
                    if (processing_non_ws) {
                        processing_non_ws = false;
                    }
                    if (!shall_merge_spaces) {
                        normalized->append(space);
                    }
                }
            }

            input_offset += norm_res.consumed_input;
        }

        if (shall_append_space) {
            normalized->append(space);
        }
    }